

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_zpz_ptr(DisasContext_conflict1 *s,int rd,int rn,int pg,_Bool is_fp16,undefined1 *fn)

{
  uint32_t oprsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  TCGv_ptr ptr;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    oprsz = s->sve_len;
    ptr = get_fpstatus_ptr_aarch64(tcg_ctx,is_fp16);
    tcg_gen_gvec_3_ptr_aarch64
              (tcg_ctx,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,pg * 0x20 + 0x2c10,ptr,oprsz,oprsz,0,fn
              );
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool do_zpz_ptr(DisasContext *s, int rd, int rn, int pg,
                       bool is_fp16, gen_helper_gvec_3_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, is_fp16);
        tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                           vec_full_reg_offset(s, rn),
                           pred_full_reg_offset(s, pg),
                           status, vsz, vsz, 0, fn);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}